

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

LY_ERR xpath_current(lyxp_set **args,uint32_t arg_count,lyxp_set *set,uint32_t options)

{
  LY_ERR LVar1;
  LY_ERR ret___1;
  LY_ERR ret__;
  uint32_t options_local;
  lyxp_set *set_local;
  uint32_t arg_count_local;
  lyxp_set **args_local;
  
  if ((arg_count == 0) && (args == (lyxp_set **)0x0)) {
    if ((options & 0x1c) == 0) {
      lyxp_set_free_content(set);
      if ((set->field_10).cur_node == (lyd_node *)0x0) {
        set_insert_node(set,(lyd_node *)0x0,0,set->root_type,0);
      }
      else {
        set_insert_node(set,(set->field_10).cur_node,0,LYXP_NODE_ELEM,0);
      }
    }
    else {
      set_scnode_clear_ctx(set,0);
      if ((set->field_10).cur_node == (lyd_node *)0x0) {
        LVar1 = lyxp_set_scnode_insert_node
                          (set,(lysc_node *)0x0,set->root_type,LYXP_AXIS_SELF,(uint32_t *)0x0);
      }
      else {
        LVar1 = lyxp_set_scnode_insert_node
                          (set,(set->field_10).cur_scnode,LYXP_NODE_ELEM,LYXP_AXIS_SELF,
                           (uint32_t *)0x0);
      }
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
    }
    args_local._4_4_ = LY_SUCCESS;
  }
  else {
    ly_vlog(set->ctx,(char *)0x0,LYVE_XPATH,
            "Invalid number of arguments (%u) for the XPath function %.*s.",(ulong)arg_count,9,
            "current()");
    args_local._4_4_ = LY_EVALID;
  }
  return args_local._4_4_;
}

Assistant:

static LY_ERR
xpath_current(struct lyxp_set **args, uint32_t arg_count, struct lyxp_set *set, uint32_t options)
{
    if (arg_count || args) {
        LOGVAL(set->ctx, LY_VCODE_XP_INARGCOUNT, arg_count, LY_PRI_LENSTR("current()"));
        return LY_EVALID;
    }

    if (options & LYXP_SCNODE_ALL) {
        set_scnode_clear_ctx(set, LYXP_SET_SCNODE_ATOM_NODE);

        if (set->cur_scnode) {
            LY_CHECK_RET(lyxp_set_scnode_insert_node(set, set->cur_scnode, LYXP_NODE_ELEM, LYXP_AXIS_SELF, NULL));
        } else {
            /* root node */
            LY_CHECK_RET(lyxp_set_scnode_insert_node(set, NULL, set->root_type, LYXP_AXIS_SELF, NULL));
        }
    } else {
        lyxp_set_free_content(set);

        if (set->cur_node) {
            /* position is filled later */
            set_insert_node(set, set->cur_node, 0, LYXP_NODE_ELEM, 0);
        } else {
            /* root node */
            set_insert_node(set, NULL, 0, set->root_type, 0);
        }
    }

    return LY_SUCCESS;
}